

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall xLearn::Parser::~Parser(Parser *this)

{
  pointer pcVar1;
  
  this->_vptr_Parser = (_func_int **)&PTR__Parser_001b46f8;
  pcVar1 = (this->splitor_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->splitor_).field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

virtual ~Parser() {  }